

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.cpp
# Opt level: O1

Matrix3d *
eulerAnglesToRotationMatrix(Matrix3d *__return_storage_ptr__,double roll,double pitch,double yaw)

{
  Matrix3 *res;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar1 = cos(yaw * 0.5);
  dVar2 = sin(yaw * 0.5);
  dVar3 = dVar2 * 0.0;
  dVar4 = cos(pitch * 0.5);
  dVar5 = sin(pitch * 0.5);
  dVar12 = dVar5 * 0.0;
  dVar13 = dVar5 * 1.0;
  dVar5 = dVar5 * 0.0;
  dVar8 = dVar2 * dVar12 - dVar3 * dVar5;
  auVar10._8_4_ = SUB84(dVar8,0);
  auVar10._0_8_ = dVar2 * dVar13 - dVar3 * dVar4;
  auVar10._12_4_ = (int)((ulong)dVar8 >> 0x20);
  dVar9 = SUB168(auVar10 ^ ZEXT816(0x8000000000000000),0) + dVar1 * dVar12 + dVar3 * dVar5;
  dVar11 = SUB168(auVar10 ^ ZEXT816(0x8000000000000000),8) + dVar1 * dVar13 + dVar3 * dVar4;
  dVar8 = -(dVar5 * dVar2 + dVar12 * dVar3) + (dVar1 * dVar4 - dVar13 * dVar3);
  dVar3 = dVar4 * dVar2 + dVar13 * dVar3 + (dVar1 * dVar5 - dVar12 * dVar3);
  dVar1 = cos(roll * 0.5);
  dVar2 = sin(roll * 0.5);
  dVar5 = dVar2 * 1.0;
  dVar13 = dVar2 * 0.0;
  dVar2 = dVar2 * 0.0;
  dVar4 = dVar5 * dVar3 - dVar2 * dVar9;
  auVar6._8_4_ = SUB84(dVar4,0);
  auVar6._0_8_ = dVar13 * dVar3 - dVar1 * dVar9;
  auVar6._12_4_ = (int)((ulong)dVar4 >> 0x20);
  dVar12 = SUB168(auVar6 ^ ZEXT816(0x8000000000000000),0) + dVar2 * dVar11 + dVar5 * dVar8;
  dVar7 = SUB168(auVar6 ^ ZEXT816(0x8000000000000000),8) + dVar1 * dVar11 + dVar13 * dVar8;
  dVar4 = -(dVar9 * dVar5 + dVar3 * dVar2) + (dVar8 * dVar1 - dVar11 * dVar13);
  dVar2 = dVar9 * dVar13 + dVar3 * dVar1 + (dVar8 * dVar2 - dVar11 * dVar5);
  dVar3 = dVar7 + dVar7;
  dVar8 = dVar2 + dVar2;
  dVar5 = dVar4 * (dVar12 + dVar12);
  dVar1 = (dVar12 + dVar12) * dVar12;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = 1.0 - (dVar8 * dVar2 + dVar3 * dVar7);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar12 * dVar3 - dVar4 * dVar8;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar12 * dVar8 + dVar4 * dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] = dVar12 * dVar3 + dVar4 * dVar8;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = 1.0 - (dVar8 * dVar2 + dVar1);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar7 * dVar8 - dVar5;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar12 * dVar8 - dVar4 * dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = dVar7 * dVar8 + dVar5;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] = 1.0 - (dVar3 * dVar7 + dVar1);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d eulerAnglesToRotationMatrix(double roll, double pitch,
                                            double yaw) {
  Eigen::AngleAxisd rollAngle(roll, Eigen::Vector3d::UnitX());
  Eigen::AngleAxisd pitchAngle(pitch, Eigen::Vector3d::UnitY());
  Eigen::AngleAxisd yawAngle(yaw, Eigen::Vector3d::UnitZ());
  Eigen::Quaternion<double> q = yawAngle * pitchAngle * rollAngle;
  Eigen::Matrix3d rotationMatrix = q.matrix();
  return rotationMatrix;
}